

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_comment<0>(xml_document<char> *this,char **text)

{
  parse_error *this_00;
  bool bVar1;
  char **text_local;
  xml_document<char> *this_local;
  
  while( true ) {
    bVar1 = true;
    if (**text == '-') {
      bVar1 = true;
      if ((*text)[1] == '-') {
        bVar1 = (*text)[2] != '>';
      }
    }
    if (!bVar1) break;
    if (**text == '\0') {
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      parse_error::parse_error(this_00,"unexpected end of data",*text);
      __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
    }
    *text = *text + 1;
  }
  *text = *text + 3;
  return (xml_node<char> *)0x0;
}

Assistant:

xml_node<Ch> *parse_comment(Ch *&text)
        {
            // If parsing of comments is disabled
            if (!(Flags & parse_comment_nodes))
            {
                // Skip until end of comment
                while (text[0] != Ch('-') || text[1] != Ch('-') || text[2] != Ch('>'))
                {
                    if (!text[0])
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }
                text += 3;     // Skip '-->'
                return 0;      // Do not produce comment node
            }

            // Remember value start
            Ch *value = text;

            // Skip until end of comment
            while (text[0] != Ch('-') || text[1] != Ch('-') || text[2] != Ch('>'))
            {
                if (!text[0])
                    RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                ++text;
            }

            // Create comment node
            xml_node<Ch> *comment = this->allocate_node(node_comment);
            comment->value(value, text - value);
            
            // Place zero terminator after comment value
            if (!(Flags & parse_no_string_terminators))
                *text = Ch('\0');
            
            text += 3;     // Skip '-->'
            return comment;
        }